

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

void init_gbasystem(char *romfile,char *bios_file,_Bool enable_frontend)

{
  char *pcVar1;
  char **ppcVar2;
  long in_RSI;
  _func_void_uint32_t_uint32_t_access_type_t *in_RDI;
  int i;
  _func_uint16_t_uint32_t_access_type_t *in_stack_00000018;
  _func_uint8_t_uint32_t_access_type_t *in_stack_00000020;
  char *in_stack_00001000;
  int in_stack_0000100c;
  char *in_stack_00001010;
  int local_18;
  undefined1 enable_graphics;
  
  mem = init_mem();
  load_gbarom((char *)CONCAT17(enable_frontend,_i));
  pcVar1 = get_backup_path(in_stack_00001000);
  mem->backup_path = pcVar1;
  ppcVar2 = (char **)malloc(0x50);
  mem->savestate_path = ppcVar2;
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    pcVar1 = get_savestate_path(in_stack_00001010,in_stack_0000100c);
    mem->savestate_path[local_18] = pcVar1;
  }
  if (in_RSI != 0) {
    load_alternate_bios((char *)CONCAT17(enable_frontend,_i));
  }
  enable_graphics = (undefined1)((ulong)in_RSI >> 0x18);
  cpu = init_arm7tdmi(in_stack_00000020,in_stack_00000018,
                      (_func_uint32_t_uint32_t_access_type_t *)romfile,
                      (_func_void_uint32_t_uint8_t_access_type_t *)bios_file,
                      (_func_void_uint32_t_uint16_t_access_type_t *)CONCAT17(enable_frontend,_i),
                      in_RDI);
  fill_pipe((arm7tdmi_t *)0x103509);
  ppu = init_ppu((_Bool)enable_graphics);
  bus = init_gbabus();
  apu = init_apu(enable_frontend);
  return;
}

Assistant:

void init_gbasystem(const char* romfile, const char* bios_file, bool enable_frontend) {
    mem = init_mem();

    load_gbarom(romfile);
    mem->backup_path = get_backup_path(romfile);
    mem->savestate_path = malloc(NUM_SAVESTATES * sizeof(char*));
    for (int i = 0; i < NUM_SAVESTATES; i++) {
        mem->savestate_path[i] = get_savestate_path(romfile, i + 1);
    }
    if (bios_file) {
        load_alternate_bios(bios_file);
    }

    // Initialize the CPU, hook it up to the GBA bus
    cpu = init_arm7tdmi(gba_read_byte,
                        gba_read_half,
                        gba_read_word,
                        gba_write_byte,
                        gba_write_half,
                        gba_write_word);
    fill_pipe(cpu);

    ppu = init_ppu(enable_frontend);
    bus = init_gbabus();
    apu = init_apu(enable_frontend);
}